

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void BFS(void)

{
  Table state;
  Table b;
  Table possibleState_00;
  Table possibleState_01;
  Table currentState_00;
  Table state_00;
  Table state_01;
  Table state_02;
  Table state_03;
  bool bVar1;
  ostream *poVar2;
  bool local_2b5;
  byte local_2b2;
  Table local_290;
  Cell local_278 [2] [3];
  Cell CStack_272;
  Cell CStack_271;
  Cell aaCStack_270 [5] [3];
  Table local_260;
  Cell local_248 [2] [3];
  Cell CStack_242;
  Cell CStack_241;
  Cell aaCStack_240 [5] [3];
  Table local_230;
  Cell local_218 [2] [3];
  Cell CStack_212;
  Cell CStack_211;
  Cell aaCStack_210 [5] [3];
  Table local_200;
  int local_1e8;
  int iStack_1e4;
  Cell aaCStack_1e0 [10] [3];
  Cell aaCStack_1c0 [5] [3];
  Table local_1b0;
  int local_198;
  int iStack_194;
  Cell aaCStack_190 [5] [3];
  Table local_180;
  pointer local_168;
  Cell aaCStack_160 [5] [3];
  int local_150;
  int local_14c;
  int counter;
  int col;
  int row;
  int local_138;
  int iStack_134;
  undefined1 local_120 [8];
  Heuristics heuristics;
  Table possibleState;
  Table currentState;
  
  Table::Table((Table *)&possibleState.current_col);
  Table::Table((Table *)&heuristics.targetState.current_col);
  Heuristics::Heuristics((Heuristics *)local_120);
  local_138 = possibleState.current_col;
  iStack_134 = possibleState.evaluationScore;
  state._8_8_ = currentState.table._0_8_;
  state.table._0_8_ = possibleState._16_8_;
  state._16_8_ = currentState._8_8_;
  Heuristics::addToFrontierBFS((Heuristics *)local_120,state);
  local_150 = 0;
  do {
    aaCStack_160[2][2].number = heuristics.targetState.table[2][2].number;
    aaCStack_160[3] = (Cell  [3])heuristics.targetState._9_3_;
    stack0xfffffffffffffeac = heuristics.targetState.current_row;
    local_168 = heuristics.evaluatedChildren.super__Vector_base<Table,_std::allocator<Table>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    aaCStack_160[0][0].number = heuristics.targetState.table[0][0].number;
    aaCStack_160[0][1].number = heuristics.targetState.table[0][1].number;
    aaCStack_160[0][2].number = heuristics.targetState.table[0][2].number;
    aaCStack_160[1][0].number = heuristics.targetState.table[1][0].number;
    aaCStack_160[1][1].number = heuristics.targetState.table[1][1].number;
    aaCStack_160[1][2].number = heuristics.targetState.table[1][2].number;
    aaCStack_160[2][0].number = heuristics.targetState.table[2][0].number;
    aaCStack_160[2][1].number = heuristics.targetState.table[2][1].number;
    b._8_8_ = heuristics.targetState.table._0_8_;
    b.table._0_8_ =
         heuristics.evaluatedChildren.super__Vector_base<Table,_std::allocator<Table>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    b._16_8_ = heuristics.targetState._8_8_;
    bVar1 = Table::equals((Table *)&possibleState.current_col,b);
    local_2b2 = 0;
    if (!bVar1) {
      bVar1 = std::queue<Table,_std::deque<Table,_std::allocator<Table>_>_>::empty
                        ((queue<Table,_std::deque<Table,_std::allocator<Table>_>_> *)
                         ((long)&heuristics.frontier.c.
                                 super__Deque_base<Table,_std::allocator<Table>_>._M_impl.
                                 super__Deque_impl_data._M_finish + 0x18));
      local_2b2 = bVar1 ^ 0xff;
    }
    if ((local_2b2 & 1) == 0) goto LAB_00101e16;
    Heuristics::popFromFrontierBFS(&local_180,(Heuristics *)local_120);
    possibleState._16_8_ = local_180.table._0_8_;
    currentState.table._0_8_ = local_180._8_8_;
    currentState._8_8_ = local_180._16_8_;
    while( true ) {
      bVar1 = std::queue<Table,_std::deque<Table,_std::allocator<Table>_>_>::empty
                        ((queue<Table,_std::deque<Table,_std::allocator<Table>_>_> *)
                         ((long)&heuristics.frontier.c.
                                 super__Deque_base<Table,_std::allocator<Table>_>._M_impl.
                                 super__Deque_impl_data._M_finish + 0x18));
      local_2b5 = false;
      if (!bVar1) {
        aaCStack_190[2][2].number = currentState.table[2][2].number;
        aaCStack_190[3] = (Cell  [3])currentState._9_3_;
        stack0xfffffffffffffe7c = currentState.current_row;
        local_198 = possibleState.current_col;
        iStack_194 = possibleState.evaluationScore;
        aaCStack_190[0][0].number = currentState.table[0][0].number;
        aaCStack_190[0][1].number = currentState.table[0][1].number;
        aaCStack_190[0][2].number = currentState.table[0][2].number;
        aaCStack_190[1][0].number = currentState.table[1][0].number;
        aaCStack_190[1][1].number = currentState.table[1][1].number;
        aaCStack_190[1][2].number = currentState.table[1][2].number;
        aaCStack_190[2][0].number = currentState.table[2][0].number;
        aaCStack_190[2][1].number = currentState.table[2][1].number;
        possibleState_00._8_8_ = currentState.table._0_8_;
        possibleState_00.table._0_8_ = possibleState._16_8_;
        possibleState_00._16_8_ = currentState._8_8_;
        local_2b5 = Heuristics::existsInVisited((Heuristics *)local_120,possibleState_00);
      }
      if (local_2b5 == false) break;
      Heuristics::popFromFrontierBFS(&local_1b0,(Heuristics *)local_120);
      possibleState.current_col._0_1_ = local_1b0.table[0][0].number;
      possibleState.current_col._1_1_ = local_1b0.table[0][1].number;
      possibleState.current_col._2_1_ = local_1b0.table[0][2].number;
      possibleState.current_col._3_1_ = local_1b0.table[1][0].number;
      possibleState.evaluationScore._0_1_ = local_1b0.table[1][1].number;
      possibleState.evaluationScore._1_1_ = local_1b0.table[1][2].number;
      possibleState.evaluationScore._2_1_ = local_1b0.table[2][0].number;
      possibleState.evaluationScore._3_1_ = local_1b0.table[2][1].number;
      currentState.table._0_8_ = local_1b0._8_8_;
      currentState._8_8_ = local_1b0._16_8_;
    }
    bVar1 = std::queue<Table,_std::deque<Table,_std::allocator<Table>_>_>::empty
                      ((queue<Table,_std::deque<Table,_std::allocator<Table>_>_> *)
                       ((long)&heuristics.frontier.c.
                               super__Deque_base<Table,_std::allocator<Table>_>._M_impl.
                               super__Deque_impl_data._M_finish + 0x18));
    if (!bVar1) {
      aaCStack_1c0[2][2].number = currentState.table[2][2].number;
      aaCStack_1c0[3] = (Cell  [3])currentState._9_3_;
      stack0xfffffffffffffe4c = currentState.current_row;
      aaCStack_1e0._24_4_ = possibleState.current_col;
      stack0xfffffffffffffe3c = possibleState.evaluationScore;
      aaCStack_1c0[0][0].number = currentState.table[0][0].number;
      aaCStack_1c0[0][1].number = currentState.table[0][1].number;
      aaCStack_1c0[0][2].number = currentState.table[0][2].number;
      aaCStack_1c0[1][0].number = currentState.table[1][0].number;
      aaCStack_1c0[1][1].number = currentState.table[1][1].number;
      aaCStack_1c0[1][2].number = currentState.table[1][2].number;
      aaCStack_1c0[2][0].number = currentState.table[2][0].number;
      aaCStack_1c0[2][1].number = currentState.table[2][1].number;
      possibleState_01._8_8_ = currentState.table._0_8_;
      possibleState_01.table._0_8_ = possibleState._16_8_;
      possibleState_01._16_8_ = currentState._8_8_;
      bVar1 = Heuristics::existsInVisited((Heuristics *)local_120,possibleState_01);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"No solution");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
LAB_00101e16:
        poVar2 = std::operator<<((ostream *)&std::cout,"Different states visited: ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_150);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        Heuristics::~Heuristics((Heuristics *)local_120);
        return;
      }
    }
    aaCStack_1e0._8_8_ = currentState._8_8_;
    local_1e8 = possibleState.current_col;
    iStack_1e4 = possibleState.evaluationScore;
    aaCStack_1e0[0][0].number = currentState.table[0][0].number;
    aaCStack_1e0[0][1].number = currentState.table[0][1].number;
    aaCStack_1e0[0][2].number = currentState.table[0][2].number;
    aaCStack_1e0[1][0].number = currentState.table[1][0].number;
    aaCStack_1e0[1][1].number = currentState.table[1][1].number;
    aaCStack_1e0[1][2].number = currentState.table[1][2].number;
    aaCStack_1e0[2][0].number = currentState.table[2][0].number;
    aaCStack_1e0[2][1].number = currentState.table[2][1].number;
    currentState_00._8_8_ = currentState.table._0_8_;
    currentState_00.table._0_8_ = possibleState._16_8_;
    currentState_00._16_8_ = currentState._8_8_;
    Heuristics::addToVisited((Heuristics *)local_120,currentState_00);
    counter._0_1_ = currentState.table[1][1].number;
    counter._1_1_ = currentState.table[1][2].number;
    counter._2_1_ = currentState.table[2][0].number;
    counter._3_1_ = currentState.table[2][1].number;
    local_14c = currentState._8_4_;
    if (-1 < currentState.table._4_4_ + -1) {
      Table::move(&local_200,(Table *)&possibleState.current_col,up,currentState.table._4_4_,
                  currentState._8_4_);
      possibleState._8_8_ = local_200._16_8_;
      heuristics.targetState._16_8_ = local_200.table._0_8_;
      possibleState.table._0_8_ = local_200._8_8_;
      stack0xfffffffffffffdf8 = local_200._16_8_;
      local_218[0][0].number = local_200.table[0][0].number;
      local_218[0][1].number = local_200.table[0][1].number;
      local_218[0][2].number = local_200.table[0][2].number;
      local_218[1][0].number = local_200.table[1][0].number;
      local_218[1][1].number = local_200.table[1][1].number;
      local_218[1][2].number = local_200.table[1][2].number;
      CStack_212.number = local_200.table[2][0].number;
      CStack_211.number = local_200.table[2][1].number;
      aaCStack_210._0_8_ = local_200._8_8_;
      state_00.table[2][2].number = local_200.table[2][2].number;
      state_00._9_3_ = local_200._9_3_;
      state_00.current_row = local_200.current_row;
      state_00.table[0][0].number = local_200.table[0][0].number;
      state_00.table[0][1].number = local_200.table[0][1].number;
      state_00.table[0][2].number = local_200.table[0][2].number;
      state_00.table[1][0].number = local_200.table[1][0].number;
      state_00.table[1][1].number = local_200.table[1][1].number;
      state_00.table[1][2].number = local_200.table[1][2].number;
      state_00.table[2][0].number = local_200.table[2][0].number;
      state_00.table[2][1].number = local_200.table[2][1].number;
      state_00.current_col = local_200.current_col;
      state_00.evaluationScore = local_200.evaluationScore;
      Heuristics::addToFrontierBFS((Heuristics *)local_120,state_00);
    }
    if (counter + 1 < 3) {
      Table::move(&local_230,(Table *)&possibleState.current_col,down,counter,local_14c);
      possibleState._8_8_ = local_230._16_8_;
      heuristics.targetState._16_8_ = local_230.table._0_8_;
      possibleState.table._0_8_ = local_230._8_8_;
      stack0xfffffffffffffdc8 = local_230._16_8_;
      local_248[0][0].number = local_230.table[0][0].number;
      local_248[0][1].number = local_230.table[0][1].number;
      local_248[0][2].number = local_230.table[0][2].number;
      local_248[1][0].number = local_230.table[1][0].number;
      local_248[1][1].number = local_230.table[1][1].number;
      local_248[1][2].number = local_230.table[1][2].number;
      CStack_242.number = local_230.table[2][0].number;
      CStack_241.number = local_230.table[2][1].number;
      aaCStack_240._0_8_ = local_230._8_8_;
      state_01.table[2][2].number = local_230.table[2][2].number;
      state_01._9_3_ = local_230._9_3_;
      state_01.current_row = local_230.current_row;
      state_01.table[0][0].number = local_230.table[0][0].number;
      state_01.table[0][1].number = local_230.table[0][1].number;
      state_01.table[0][2].number = local_230.table[0][2].number;
      state_01.table[1][0].number = local_230.table[1][0].number;
      state_01.table[1][1].number = local_230.table[1][1].number;
      state_01.table[1][2].number = local_230.table[1][2].number;
      state_01.table[2][0].number = local_230.table[2][0].number;
      state_01.table[2][1].number = local_230.table[2][1].number;
      state_01.current_col = local_230.current_col;
      state_01.evaluationScore = local_230.evaluationScore;
      Heuristics::addToFrontierBFS((Heuristics *)local_120,state_01);
    }
    if (-1 < local_14c + -1) {
      Table::move(&local_260,(Table *)&possibleState.current_col,left,counter,local_14c);
      possibleState._8_8_ = local_260._16_8_;
      heuristics.targetState._16_8_ = local_260.table._0_8_;
      possibleState.table._0_8_ = local_260._8_8_;
      stack0xfffffffffffffd98 = local_260._16_8_;
      local_278[0][0].number = local_260.table[0][0].number;
      local_278[0][1].number = local_260.table[0][1].number;
      local_278[0][2].number = local_260.table[0][2].number;
      local_278[1][0].number = local_260.table[1][0].number;
      local_278[1][1].number = local_260.table[1][1].number;
      local_278[1][2].number = local_260.table[1][2].number;
      CStack_272.number = local_260.table[2][0].number;
      CStack_271.number = local_260.table[2][1].number;
      aaCStack_270._0_8_ = local_260._8_8_;
      state_02.table[2][2].number = local_260.table[2][2].number;
      state_02._9_3_ = local_260._9_3_;
      state_02.current_row = local_260.current_row;
      state_02.table[0][0].number = local_260.table[0][0].number;
      state_02.table[0][1].number = local_260.table[0][1].number;
      state_02.table[0][2].number = local_260.table[0][2].number;
      state_02.table[1][0].number = local_260.table[1][0].number;
      state_02.table[1][1].number = local_260.table[1][1].number;
      state_02.table[1][2].number = local_260.table[1][2].number;
      state_02.table[2][0].number = local_260.table[2][0].number;
      state_02.table[2][1].number = local_260.table[2][1].number;
      state_02.current_col = local_260.current_col;
      state_02.evaluationScore = local_260.evaluationScore;
      Heuristics::addToFrontierBFS((Heuristics *)local_120,state_02);
    }
    if (local_14c + 1 < 3) {
      Table::move(&local_290,(Table *)&possibleState.current_col,right,counter,local_14c);
      possibleState._8_8_ = local_290._16_8_;
      heuristics.targetState._16_8_ = local_290.table._0_8_;
      possibleState.table._0_8_ = local_290._8_8_;
      state_03.table[2][2].number = local_290.table[2][2].number;
      state_03._9_3_ = local_290._9_3_;
      state_03.current_row = local_290.current_row;
      state_03.table[0][0].number = local_290.table[0][0].number;
      state_03.table[0][1].number = local_290.table[0][1].number;
      state_03.table[0][2].number = local_290.table[0][2].number;
      state_03.table[1][0].number = local_290.table[1][0].number;
      state_03.table[1][1].number = local_290.table[1][1].number;
      state_03.table[1][2].number = local_290.table[1][2].number;
      state_03.table[2][0].number = local_290.table[2][0].number;
      state_03.table[2][1].number = local_290.table[2][1].number;
      state_03.current_col = local_290.current_col;
      state_03.evaluationScore = local_290.evaluationScore;
      Heuristics::addToFrontierBFS((Heuristics *)local_120,state_03);
    }
    local_150 = local_150 + 1;
  } while( true );
}

Assistant:

void BFS() {
    Table currentState = Table();
    Table possibleState;
    Heuristics heuristics = Heuristics();
    heuristics.addToFrontierBFS(currentState);
    int row;
    int col;
    int counter = 0;
    while ((!currentState.equals(heuristics.targetState)) && !heuristics.frontierQ.empty()){
        currentState = heuristics.popFromFrontierBFS();
        while(!heuristics.frontierQ.empty() && heuristics.existsInVisited(currentState)) {
            currentState = heuristics.popFromFrontierBFS();
        }
        if (!heuristics.frontierQ.empty() && heuristics.existsInVisited(currentState)){
            std::cout << "No solution" << std::endl;
            break;
        }
        heuristics.addToVisited(currentState);
        row = currentState.current_row;
        col = currentState.current_col;
        if (row - 1 >= 0) {
            possibleState = currentState.move(Table::up, row, col);
            heuristics.addToFrontierBFS(possibleState);
        }
        if (row + 1 < 3) {
            possibleState = currentState.move(Table::down, row, col);
            heuristics.addToFrontierBFS(possibleState);
        }
        if (col - 1 >= 0) {
            possibleState = currentState.move(Table::left, row, col);
            heuristics.addToFrontierBFS(possibleState);
        }
        if (col + 1 < 3) {
            possibleState = currentState.move(Table::right, row, col);
            heuristics.addToFrontierBFS(possibleState);
        }
        counter++;
    }
    std::cout << "Different states visited: " << counter << std::endl;
}